

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O0

void __thiscall
QUnhandledException::QUnhandledException(QUnhandledException *this,exception_ptr *exception)

{
  exception_ptr *in_RSI;
  exception_ptr *in_RDI;
  long in_FS_OFFSET;
  QUnhandledExceptionPrivate *data;
  QUnhandledExceptionPrivate *this_00;
  QUnhandledExceptionPrivate local_10;
  
  local_10.exceptionPtr._M_exception_object = *(void **)(in_FS_OFFSET + 0x28);
  QException::QException((QException *)in_RSI);
  in_RDI->_M_exception_object = &PTR__QUnhandledException_00bea6c8;
  this_00 = (QUnhandledExceptionPrivate *)(in_RDI + 1);
  operator_new(0x10);
  data = &local_10;
  std::__exception_ptr::exception_ptr::exception_ptr(in_RSI,(exception_ptr *)data);
  QUnhandledExceptionPrivate::QUnhandledExceptionPrivate(this_00,in_RDI);
  QSharedDataPointer<QUnhandledExceptionPrivate>::QSharedDataPointer
            ((QSharedDataPointer<QUnhandledExceptionPrivate> *)in_RSI,data);
  std::__exception_ptr::exception_ptr::~exception_ptr(in_RSI);
  if (*(void **)(in_FS_OFFSET + 0x28) == local_10.exceptionPtr._M_exception_object) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUnhandledException::QUnhandledException(std::exception_ptr exception) noexcept
    : d(new QUnhandledExceptionPrivate(exception))
{
}